

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_exp(sexp ctx,sexp z)

{
  sexp psVar1;
  sexp in_RDI;
  double dVar2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  double y;
  double e2x;
  sexp in_stack_ffffffffffffffa8;
  sexp in_stack_ffffffffffffffb0;
  sexp in_stack_ffffffffffffffb8;
  sexp in_stack_ffffffffffffffc0;
  sexp_gc_var_t local_38;
  sexp local_28;
  double local_20;
  double local_18;
  sexp local_8;
  
  local_8 = in_RDI;
  dVar2 = sexp_to_double(in_stack_ffffffffffffffa8,(sexp)0x130181);
  local_18 = exp(dVar2);
  local_20 = sexp_to_double(in_stack_ffffffffffffffa8,(sexp)0x13019f);
  local_28 = (sexp)0x43e;
  memset(&local_38,0,0x10);
  local_38.var = &local_28;
  local_38.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_38;
  local_28 = sexp_make_complex(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                               in_stack_ffffffffffffffb0);
  dVar2 = local_18;
  cos(local_20);
  psVar1 = sexp_make_flonum(in_stack_ffffffffffffffb8,dVar2);
  (local_28->value).type.name = psVar1;
  psVar1 = local_8;
  sin(local_20);
  psVar1 = sexp_make_flonum(psVar1,dVar2);
  (local_28->value).type.cpl = psVar1;
  (local_8->value).context.saves = local_38.next;
  return local_28;
}

Assistant:

sexp sexp_complex_exp (sexp ctx, sexp z) {
  double e2x = exp(sexp_to_double(ctx, sexp_complex_real(z))),
    y = sexp_to_double(ctx, sexp_complex_imag(z));
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(res) = sexp_make_flonum(ctx, e2x*cos(y));
  sexp_complex_imag(res) = sexp_make_flonum(ctx, e2x*sin(y));
  sexp_gc_release1(ctx);
  return res;
}